

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.cpp
# Opt level: O0

bool __thiscall fineftp::Filesystem::FileStatus::canOpenDir(FileStatus *this)

{
  FileType FVar1;
  char *__name;
  DIR *__dirp;
  DIR *dp;
  bool can_open_dir;
  FileStatus *this_local;
  
  if ((this->is_ok_ & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    FVar1 = type(this);
    if (FVar1 == Dir) {
      __name = (char *)::std::__cxx11::string::c_str();
      __dirp = opendir(__name);
      this_local._7_1_ = __dirp != (DIR *)0x0;
      closedir(__dirp);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool FileStatus::canOpenDir() const
  {
    if (!is_ok_)
      return false;

    if (type() != FileType::Dir)
      return false;

    bool can_open_dir(false);
#ifdef WIN32
    std::string find_file_path = path_ + "\\*";
    std::replace(find_file_path.begin(), find_file_path.end(), '/', '\\');

    std::wstring w_find_file_path = StrConvert::Utf8ToWide(find_file_path);

    HANDLE hFind;
    WIN32_FIND_DATAW ffd;
    hFind = FindFirstFileW(w_find_file_path.c_str(), &ffd);
    if (hFind != INVALID_HANDLE_VALUE)
    {
      can_open_dir = true;
    }
    FindClose(hFind);
#else // WIN32
    DIR *dp;
    if ((dp = opendir(path_.c_str())) != NULL)
    {
      can_open_dir = true;
    }
    closedir(dp);
#endif // WIN32

    return can_open_dir;
  }